

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O1

void j2k_write_coc(opj_j2k_t *j2k,int compno)

{
  opj_image_t *poVar1;
  opj_tcp_t *poVar2;
  opj_cio_t *cio;
  int pos;
  int iVar3;
  
  poVar1 = j2k->image;
  poVar2 = j2k->cp->tcps;
  iVar3 = j2k->curtileno;
  cio = j2k->cio;
  cio_write(cio,0xff53,2);
  pos = cio_tell(cio);
  cio_skip(cio,2);
  cio_write(cio,(long)compno,2 - (uint)(poVar1->numcomps < 0x101));
  cio_write(cio,(ulong)poVar2[iVar3].tccps[compno].csty,1);
  j2k_write_cox(j2k,compno);
  iVar3 = cio_tell(cio);
  cio_seek(cio,pos);
  cio_write(cio,(long)(iVar3 - pos),2);
  cio_seek(cio,iVar3);
  return;
}

Assistant:

static void j2k_write_coc(opj_j2k_t *j2k, int compno) {
	int lenp, len;

	opj_cp_t *cp = j2k->cp;
	opj_tcp_t *tcp = &cp->tcps[j2k->curtileno];
	opj_image_t *image = j2k->image;
	opj_cio_t *cio = j2k->cio;
	
	cio_write(cio, J2K_MS_COC, 2);	/* COC */
	lenp = cio_tell(cio);
	cio_skip(cio, 2);
	cio_write(cio, compno, image->numcomps <= 256 ? 1 : 2);	/* Ccoc */
	cio_write(cio, tcp->tccps[compno].csty, 1);	/* Scoc */
	j2k_write_cox(j2k, compno);
	len = cio_tell(cio) - lenp;
	cio_seek(cio, lenp);
	cio_write(cio, len, 2);			/* Lcoc */
	cio_seek(cio, lenp + len);
}